

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall CryptoUtil_HmacSha256_Test::TestBody(CryptoUtil_HmacSha256_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_110;
  Message local_108;
  string local_100;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b8 [8];
  ByteData256 byte_data;
  string local_98;
  undefined1 local_78 [8];
  ByteData data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData key;
  CryptoUtil_HmacSha256_Test *this_local;
  
  key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"616975656F616975656F616975656F616975656F616975656F616975656F6169",
             &local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22",
             (allocator *)
             ((long)&byte_data.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&byte_data.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
             (ByteData *)local_28);
  cfd::core::CryptoUtil::HmacSha256
            ((ByteData256 *)local_b8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
             (ByteData *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_100,(ByteData256 *)local_b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_e0,"byte_data.GetHex().c_str()",
             "\"5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212\"",pcVar2,
             "5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212");
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x17b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha256) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
  ByteData256 byte_data = CryptoUtil::HmacSha256(key.GetBytes(), data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "5af1c9ec83a512db8ea42f288b82c8a07ed05685c28e3c4c8d4c4e1b2f40b212");
}